

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O1

REF_STATUS ref_oct_he2_qu2(REF_INT cell_face,REF_INT *qu2)

{
  switch(cell_face) {
  case 0:
    qu2[0] = 0;
    qu2[1] = 3;
    qu2[2] = 7;
    qu2[3] = 4;
    qu2[4] = 0xb;
    qu2[5] = 0xf;
    qu2[6] = 0x13;
    qu2[7] = 0xc;
    qu2[8] = 0x18;
    break;
  case 1:
    qu2[0] = 1;
    qu2[1] = 5;
    qu2[2] = 6;
    qu2[3] = 2;
    qu2[4] = 0xd;
    qu2[5] = 0x11;
    qu2[6] = 0xe;
    qu2[7] = 9;
    qu2[8] = 0x16;
    break;
  case 2:
    qu2[0] = 0;
    qu2[1] = 4;
    qu2[2] = 5;
    qu2[3] = 1;
    qu2[4] = 0xc;
    qu2[5] = 0x10;
    qu2[6] = 0xd;
    qu2[7] = 8;
    qu2[8] = 0x15;
    break;
  case 3:
    qu2[0] = 2;
    qu2[1] = 6;
    qu2[2] = 7;
    qu2[3] = 3;
    qu2[4] = 0xe;
    qu2[5] = 0x12;
    qu2[6] = 0xf;
    qu2[7] = 10;
    qu2[8] = 0x17;
    break;
  case 4:
    qu2[0] = 0;
    qu2[1] = 1;
    qu2[2] = 2;
    qu2[3] = 3;
    qu2[4] = 8;
    qu2[5] = 9;
    qu2[6] = 10;
    qu2[7] = 0xb;
    qu2[8] = 0x14;
    break;
  case 5:
    qu2[0] = 4;
    qu2[1] = 7;
    qu2[2] = 6;
    qu2[3] = 5;
    qu2[4] = 0x13;
    qu2[5] = 0x12;
    qu2[6] = 0x11;
    qu2[7] = 0x10;
    qu2[8] = 0x19;
    break;
  default:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x327,
           "ref_oct_he2_qu2","not 0-5 cell_face");
    return 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_oct_he2_qu2(REF_INT cell_face, REF_INT *qu2) {
  switch (cell_face) {
    case 0:
      qu2[0] = 0;
      qu2[1] = 3;
      qu2[2] = 7;
      qu2[3] = 4;
      qu2[4] = 11;
      qu2[5] = 15;
      qu2[6] = 19;
      qu2[7] = 12;
      qu2[8] = 24;
      break;
    case 1:
      qu2[0] = 1;
      qu2[1] = 5;
      qu2[2] = 6;
      qu2[3] = 2;
      qu2[4] = 13;
      qu2[5] = 17;
      qu2[6] = 14;
      qu2[7] = 9;
      qu2[8] = 22;
      break;
    case 2:
      qu2[0] = 0;
      qu2[1] = 4;
      qu2[2] = 5;
      qu2[3] = 1;
      qu2[4] = 12;
      qu2[5] = 16;
      qu2[6] = 13;
      qu2[7] = 8;
      qu2[8] = 21;
      break;
    case 3:
      qu2[0] = 2;
      qu2[1] = 6;
      qu2[2] = 7;
      qu2[3] = 3;
      qu2[4] = 14;
      qu2[5] = 18;
      qu2[6] = 15;
      qu2[7] = 10;
      qu2[8] = 23;
      break;
    case 4:
      qu2[0] = 0;
      qu2[1] = 1;
      qu2[2] = 2;
      qu2[3] = 3;
      qu2[4] = 8;
      qu2[5] = 9;
      qu2[6] = 10;
      qu2[7] = 11;
      qu2[8] = 20;
      break;
    case 5:
      qu2[0] = 4;
      qu2[1] = 7;
      qu2[2] = 6;
      qu2[3] = 5;
      qu2[4] = 19;
      qu2[5] = 18;
      qu2[6] = 17;
      qu2[7] = 16;
      qu2[8] = 25;
      break;
    default:
      THROW("not 0-5 cell_face");
  }

  return REF_SUCCESS;
}